

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void cmTargetCheckLINK_INTERFACE_LIBRARIES
               (string *prop,char *value,cmMakefile *context,bool imported)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_1c0;
  ostringstream e;
  
  if (cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
      ::keys == '\0') {
    iVar2 = __cxa_guard_acquire(&cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
                                 ::keys);
    if (iVar2 != 0) {
      cmsys::RegularExpression::RegularExpression
                (&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,"(^|;)(debug|optimized|general)(;|$)")
      ;
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,&__dso_handle);
      __cxa_guard_release(&cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
                           ::keys);
    }
  }
  bVar1 = cmsys::RegularExpression::find(&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,value);
  if (bVar1) {
    pcVar4 = "LINK_INTERFACE_LIBRARIES";
    if (imported) {
      pcVar4 = "IMPORTED_LINK_INTERFACE_LIBRARIES";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"Property ");
    poVar3 = std::operator<<(poVar3,(string *)prop);
    poVar3 = std::operator<<(poVar3," may not contain link-type keyword \"");
    cmsys::RegularExpression::match_abi_cxx11_
              (&local_1c0,&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,2);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
    poVar3 = std::operator<<(poVar3,"\".  ");
    poVar3 = std::operator<<(poVar3,"The ");
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," property has a per-configuration ");
    poVar3 = std::operator<<(poVar3,"version called ");
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"_<CONFIG> which may be ");
    std::operator<<(poVar3,"used to specify per-configuration rules.");
    std::__cxx11::string::~string((string *)&local_1c0);
    if (!imported) {
      poVar3 = std::operator<<((ostream *)&e,"  ");
      poVar3 = std::operator<<(poVar3,
                               "Alternatively, an IMPORTED library may be created, configured ");
      poVar3 = std::operator<<(poVar3,"with a per-configuration location, and then named in the ");
      poVar3 = std::operator<<(poVar3,"property value.  ");
      poVar3 = std::operator<<(poVar3,"See the add_library command\'s IMPORTED mode for details.");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"If you have a list of libraries that already contains the ");
      poVar3 = std::operator<<(poVar3,"keyword, use the target_link_libraries command with its ");
      poVar3 = std::operator<<(poVar3,"LINK_INTERFACE_LIBRARIES mode to set the property.  ");
      poVar3 = std::operator<<(poVar3,
                               "The command automatically recognizes link-type keywords and sets ");
      poVar3 = std::operator<<(poVar3,
                               "the LINK_INTERFACE_LIBRARIES and LINK_INTERFACE_LIBRARIES_DEBUG ");
      std::operator<<(poVar3,"properties accordingly.");
    }
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return;
}

Assistant:

static void cmTargetCheckLINK_INTERFACE_LIBRARIES(
  const std::string& prop, const char* value, cmMakefile* context,
  bool imported)
{
  // Look for link-type keywords in the value.
  static cmsys::RegularExpression
    keys("(^|;)(debug|optimized|general)(;|$)");
  if(!keys.find(value))
    {
    return;
    }

  // Support imported and non-imported versions of the property.
  const char* base = (imported?
                      "IMPORTED_LINK_INTERFACE_LIBRARIES" :
                      "LINK_INTERFACE_LIBRARIES");

  // Report an error.
  std::ostringstream e;
  e << "Property " << prop << " may not contain link-type keyword \""
    << keys.match(2) << "\".  "
    << "The " << base << " property has a per-configuration "
    << "version called " << base << "_<CONFIG> which may be "
    << "used to specify per-configuration rules.";
  if(!imported)
    {
    e << "  "
      << "Alternatively, an IMPORTED library may be created, configured "
      << "with a per-configuration location, and then named in the "
      << "property value.  "
      << "See the add_library command's IMPORTED mode for details."
      << "\n"
      << "If you have a list of libraries that already contains the "
      << "keyword, use the target_link_libraries command with its "
      << "LINK_INTERFACE_LIBRARIES mode to set the property.  "
      << "The command automatically recognizes link-type keywords and sets "
      << "the LINK_INTERFACE_LIBRARIES and LINK_INTERFACE_LIBRARIES_DEBUG "
      << "properties accordingly.";
    }
  context->IssueMessage(cmake::FATAL_ERROR, e.str());
}